

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsStatus __thiscall Highs::changeObjectiveSense(Highs *this,ObjSense sense)

{
  HighsStatus HVar1;
  
  if (((this->model_).lp_.sense_ != kMinimize) == (sense == kMinimize)) {
    (this->model_).lp_.sense_ = sense;
    clearDerivedModelProperties(this);
    invalidateModelStatusSolutionAndInfo(this);
  }
  HVar1 = returnFromHighs(this,kOk);
  return HVar1;
}

Assistant:

HighsStatus Highs::changeObjectiveSense(const ObjSense sense) {
  if ((sense == ObjSense::kMinimize) !=
      (model_.lp_.sense_ == ObjSense::kMinimize)) {
    model_.lp_.sense_ = sense;
    // Nontrivial change
    clearDerivedModelProperties();
    invalidateModelStatusSolutionAndInfo();
  }
  return returnFromHighs(HighsStatus::kOk);
}